

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMImplementationImpl.cpp
# Opt level: O3

DOMDocumentType * __thiscall
xercesc_4_0::DOMImplementationImpl::createDocumentType
          (DOMImplementationImpl *this,XMLCh *qualifiedName,XMLCh *publicId,XMLCh *systemId)

{
  bool bVar1;
  DOMDocumentTypeImpl *this_00;
  DOMException *this_01;
  
  bVar1 = XMLChar1_0::isValidName(qualifiedName);
  if (bVar1) {
    this_00 = (DOMDocumentTypeImpl *)operator_new(0xb8);
    DOMDocumentTypeImpl::DOMDocumentTypeImpl
              (this_00,(DOMDocument *)0x0,qualifiedName,publicId,systemId,true);
    return &this_00->super_DOMDocumentType;
  }
  this_01 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_01,5,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMDocumentType *DOMImplementationImpl::createDocumentType(const XMLCh *qualifiedName,
	const XMLCh * publicId, const XMLCh *systemId)
{
    // assume XML 1.0 since we do not know its version yet.
    if(!XMLChar1_0::isValidName(qualifiedName))
        throw DOMException(DOMException::INVALID_CHARACTER_ERR, 0);

    //to do: do we need to create with user's memorymanager???
    DOMDocumentTypeImpl* docType = new DOMDocumentTypeImpl(0, qualifiedName, publicId, systemId, true);
    return docType;
}